

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.h
# Opt level: O1

void __thiscall
wasm::SuffixTree::RepeatedSubstringIterator::RepeatedSubstringIterator
          (RepeatedSubstringIterator *this,SuffixTreeInternalNode *N)

{
  pointer *pppSVar1;
  iterator __position;
  SuffixTreeInternalNode *local_30;
  SuffixTreeInternalNode *N_local;
  
  this->N = &N->super_SuffixTreeNode;
  (this->RS).StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RS).StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RS).StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->InternalNodesToVisit).
  super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InternalNodesToVisit).
  super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InternalNodesToVisit).
  super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->MinLength = 2;
  if (N != (SuffixTreeInternalNode *)0x0) {
    __position._M_current =
         (this->InternalNodesToVisit).
         super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_30 = N;
    if (__position._M_current ==
        (this->InternalNodesToVisit).
        super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::SuffixTreeInternalNode*,std::allocator<wasm::SuffixTreeInternalNode*>>::
      _M_realloc_insert<wasm::SuffixTreeInternalNode*const&>
                ((vector<wasm::SuffixTreeInternalNode*,std::allocator<wasm::SuffixTreeInternalNode*>>
                  *)&this->InternalNodesToVisit,__position,&local_30);
    }
    else {
      *__position._M_current = N;
      pppSVar1 = &(this->InternalNodesToVisit).
                  super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    advance(this);
  }
  return;
}

Assistant:

RepeatedSubstringIterator(SuffixTreeInternalNode* N) : N(N) {
      // Do we have a non-null node?
      if (!N) {
        return;
      }
      // Yes. At the first step, we need to visit all of N's children.
      // Note: This means that we visit N last.
      InternalNodesToVisit.push_back(N);
      advance();
    }